

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Basic.cpp
# Opt level: O0

void __thiscall
ObserverManager_TwoProtocolsMixedUnsubscribe_Test::
~ObserverManager_TwoProtocolsMixedUnsubscribe_Test
          (ObserverManager_TwoProtocolsMixedUnsubscribe_Test *this)

{
  ObserverManager_TwoProtocolsMixedUnsubscribe_Test *this_local;
  
  ~ObserverManager_TwoProtocolsMixedUnsubscribe_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST(ObserverManager, TwoProtocolsMixedUnsubscribe) {
    std::stringstream out;
    
    B* b = new B(out);
    ObserverManager::subscribe<TicTacProtocol>(b);
    ObserverManager::subscribe<FooBarProtocol>(b);
    
    ObserverManager::notify(&TicTacProtocol::ticTac);
    ObserverManager::notify(&FooBarProtocol::bar, "Toe");
    
    ObserverManager::unsubscribe<TicTacProtocol>(b);
    
    ObserverManager::notify(&TicTacProtocol::ticTac);
    ObserverManager::notify(&FooBarProtocol::bar, "Toe");
    
    delete b;
    
    ObserverManager::notify(&TicTacProtocol::ticTac);
    ObserverManager::notify(&FooBarProtocol::bar, "Toe");
    
    EXPECT_EQ("Tic Tac Toe Toe ", out.str());
}